

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O3

QHostInfo __thiscall QHostInfoAgent::lookup(QHostInfoAgent *this,QString *hostName)

{
  char *pcVar1;
  uint uVar2;
  sockaddr *psVar3;
  int *piVar4;
  QArrayData *pQVar5;
  QHostAddress *pQVar6;
  bool bVar7;
  int iVar8;
  storage_type *psVar9;
  long lVar10;
  addrinfo *paVar11;
  storage_type *psVar12;
  char *pcVar13;
  QString *pQVar14;
  long lVar15;
  long in_FS_OFFSET;
  QByteArrayView QVar16;
  QHostAddress addr;
  QHostAddress addr_1;
  addrinfo *res;
  QString local_d8;
  undefined1 local_c0 [8];
  QArrayDataPointer<QHostAddress> local_b8;
  addrinfo local_98;
  addrinfo *local_60;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this = &DAT_aaaaaaaaaaaaaaaa;
  QHostInfo::QHostInfo((QHostInfo *)this,-1);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  QUrl::toAce(&local_58,hostName,0);
  QString::operator=((QString *)(*(long *)this + 0x38),(QString *)hostName);
  if (local_48 == (undefined1 *)0x0) {
    **(undefined4 **)this = 1;
    pcVar13 = "Invalid hostname";
    if ((hostName->d).size == 0) {
      pcVar13 = "No host name given";
    }
    QCoreApplication::translate((char *)&local_98,"QHostInfoAgent",pcVar13,0);
    QString::operator=((QString *)(*(long *)this + 8),(QString *)&local_98);
    if ((QArrayData *)local_98._0_8_ == (QArrayData *)0x0) goto LAB_001aebca;
    LOCK();
    (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    iVar8 = (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar5 = (QArrayData *)local_98._0_8_;
  }
  else {
    local_60 = (addrinfo *)0x0;
    local_98.ai_socktype = 0;
    local_98.ai_protocol = 0;
    local_98.ai_canonname = (char *)0x0;
    local_98.ai_next = (addrinfo *)0x0;
    local_98.ai_addrlen = 0;
    local_98._20_4_ = 0;
    local_98.ai_addr = (sockaddr *)0x0;
    local_98._0_8_ = (QArrayData *)0x20;
    pcVar13 = (char *)CONCAT44(uStack_4c,uStack_50);
    if (pcVar13 == (char *)0x0) {
      pcVar13 = (char *)&QByteArray::_empty;
    }
    iVar8 = getaddrinfo(pcVar13,(char *)0x0,&local_98,&local_60);
    if (iVar8 == -1) {
      local_98._0_8_ = local_98._0_8_ & 0xffffffff00000000;
      pcVar13 = (char *)CONCAT44(uStack_4c,uStack_50);
      if (pcVar13 == (char *)0x0) {
        pcVar13 = (char *)&QByteArray::_empty;
      }
      iVar8 = getaddrinfo(pcVar13,(char *)0x0,&local_98,&local_60);
    }
    if ((iVar8 + 5U < 2) || (iVar8 == -2)) {
      **(undefined4 **)this = 1;
      QCoreApplication::translate(local_c0 + 8,"QHostInfoAgent","Host not found",0);
    }
    else {
      if (iVar8 == 0) {
        local_b8.d = (Data *)0x0;
        local_b8.ptr = (QHostAddress *)0x0;
        local_b8.size = 0;
        if (local_60 == (addrinfo *)0x0) {
LAB_001aeb01:
          **(undefined4 **)this = 2;
          QCoreApplication::translate((char *)&local_d8,"QHostInfoAgent","Unknown address type",0);
          QString::operator=((QString *)(*(long *)this + 8),(QString *)&local_d8);
          if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        else {
          paVar11 = local_60;
          do {
            if (paVar11->ai_family == 10) {
              local_c0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
              QHostAddress::QHostAddress((QHostAddress *)local_c0);
              psVar3 = paVar11->ai_addr;
              QHostAddress::setAddress((QHostAddress *)local_c0,(quint8 *)(psVar3->sa_data + 6));
              iVar8 = *(int *)(psVar3[1].sa_data + 6);
              if (iVar8 != 0) {
                QString::number((uint)&local_d8,iVar8);
                QHostAddress::setScopeId((QHostAddress *)local_c0,&local_d8);
                if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
              pQVar6 = local_b8.ptr;
              pQVar14 = (QString *)local_c0;
              if (local_b8.size != 0) {
                lVar15 = local_b8.size << 3;
                lVar10 = 0;
                do {
                  if (lVar15 == lVar10) goto LAB_001ae98f;
                  bVar7 = QHostAddress::operator==
                                    ((QHostAddress *)((long)pQVar6 + lVar10),
                                     (QHostAddress *)local_c0);
                  lVar10 = lVar10 + 8;
                } while (!bVar7);
                if ((long)local_b8.ptr - (long)pQVar6 != lVar10) goto LAB_001ae9af;
              }
LAB_001ae98f:
              QtPrivate::QMovableArrayOps<QHostAddress>::emplace<QHostAddress_const&>
                        ((QMovableArrayOps<QHostAddress> *)(local_c0 + 8),local_b8.size,
                         (QHostAddress *)local_c0);
              QList<QHostAddress>::end((QList<QHostAddress> *)(local_c0 + 8));
LAB_001ae9af:
              QHostAddress::~QHostAddress((QHostAddress *)pQVar14);
            }
            else {
              if (paVar11->ai_family == 2) {
                local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                QHostAddress::QHostAddress((QHostAddress *)&local_d8);
                uVar2 = *(uint *)(paVar11->ai_addr->sa_data + 2);
                QHostAddress::setAddress
                          ((QHostAddress *)&local_d8,
                           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                           uVar2 << 0x18);
                pQVar6 = local_b8.ptr;
                pQVar14 = &local_d8;
                if (local_b8.size != 0) {
                  lVar15 = local_b8.size << 3;
                  lVar10 = 0;
                  do {
                    if (lVar15 == lVar10) goto LAB_001ae8c6;
                    bVar7 = QHostAddress::operator==
                                      ((QHostAddress *)((long)pQVar6 + lVar10),
                                       (QHostAddress *)&local_d8);
                    lVar10 = lVar10 + 8;
                  } while (!bVar7);
                  if ((long)local_b8.ptr - (long)pQVar6 != lVar10) goto LAB_001ae9af;
                }
LAB_001ae8c6:
                QtPrivate::QMovableArrayOps<QHostAddress>::emplace<QHostAddress_const&>
                          ((QMovableArrayOps<QHostAddress> *)(local_c0 + 8),local_b8.size,
                           (QHostAddress *)&local_d8);
                QList<QHostAddress>::end((QList<QHostAddress> *)(local_c0 + 8));
                goto LAB_001ae9af;
              }
              **(undefined4 **)this = 2;
              QCoreApplication::translate
                        ((char *)&local_d8,"QHostInfoAgent","Unknown address type",0);
              QString::operator=((QString *)(*(long *)this + 8),(QString *)&local_d8);
              if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
                }
              }
            }
            paVar11 = paVar11->ai_next;
          } while (paVar11 != (addrinfo *)0x0);
          if (local_b8.size == 0) goto LAB_001aeb01;
        }
        QArrayDataPointer<QHostAddress>::operator=
                  ((QArrayDataPointer<QHostAddress> *)(*(long *)this + 0x20),
                   (QArrayDataPointer<QHostAddress> *)(local_c0 + 8));
        freeaddrinfo(local_60);
        QArrayDataPointer<QHostAddress>::~QArrayDataPointer
                  ((QArrayDataPointer<QHostAddress> *)(local_c0 + 8));
        goto LAB_001aebca;
      }
      **(undefined4 **)this = 2;
      pcVar13 = gai_strerror(iVar8);
      if (pcVar13 == (char *)0x0) {
        psVar12 = (storage_type *)0x0;
      }
      else {
        psVar9 = (storage_type *)0xffffffffffffffff;
        do {
          psVar12 = psVar9 + 1;
          pcVar1 = pcVar13 + 1 + (long)psVar9;
          psVar9 = psVar12;
        } while (*pcVar1 != '\0');
      }
      QVar16.m_data = psVar12;
      QVar16.m_size = (qsizetype)(local_c0 + 8);
      QString::fromLocal8Bit(QVar16);
    }
    QString::operator=((QString *)(*(long *)this + 8),(QString *)(local_c0 + 8));
    if (&(local_b8.d)->super_QArrayData == (QArrayData *)0x0) goto LAB_001aebca;
    LOCK();
    ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    iVar8 = ((local_b8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    pQVar5 = &(local_b8.d)->super_QArrayData;
  }
  if (iVar8 == 0) {
    QArrayData::deallocate(pQVar5,2,0x10);
  }
LAB_001aebca:
  piVar4 = (int *)CONCAT44(uStack_54,local_58);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QHostInfo)(QHostInfoPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfo QHostInfoAgent::lookup(const QString &hostName)
{
    QHostInfo results;

    // IDN support
    QByteArray aceHostname = QUrl::toAce(hostName);
    results.setHostName(hostName);
    if (aceHostname.isEmpty()) {
        results.setError(QHostInfo::HostNotFound);
        results.setErrorString(hostName.isEmpty() ?
                               QCoreApplication::translate("QHostInfoAgent", "No host name given") :
                               QCoreApplication::translate("QHostInfoAgent", "Invalid hostname"));
        return results;
    }

    addrinfo *res = nullptr;
    struct addrinfo hints;
    memset(&hints, 0, sizeof(hints));
    hints.ai_family = PF_UNSPEC;
#ifdef Q_ADDRCONFIG
    hints.ai_flags = Q_ADDRCONFIG;
#endif

    int result = getaddrinfo(aceHostname.constData(), nullptr, &hints, &res);
# ifdef Q_ADDRCONFIG
    if (result == EAI_BADFLAGS) {
        // if the lookup failed with AI_ADDRCONFIG set, try again without it
        hints.ai_flags = 0;
        result = getaddrinfo(aceHostname.constData(), nullptr, &hints, &res);
    }
# endif

    if (result == 0) {
        addrinfo *node = res;
        QList<QHostAddress> addresses;
        while (node) {
#ifdef QHOSTINFO_DEBUG
            qDebug() << "getaddrinfo node: flags:" << node->ai_flags << "family:" << node->ai_family
                     << "ai_socktype:" << node->ai_socktype << "ai_protocol:" << node->ai_protocol
                     << "ai_addrlen:" << node->ai_addrlen;
#endif
            switch (node->ai_family) {
            case AF_INET: {
                QHostAddress addr;
                addr.setAddress(ntohl(((sockaddr_in *) node->ai_addr)->sin_addr.s_addr));
                if (!addresses.contains(addr))
                    addresses.append(addr);
                break;
            }
            case AF_INET6: {
                QHostAddress addr;
                sockaddr_in6 *sa6 = (sockaddr_in6 *) node->ai_addr;
                addr.setAddress(sa6->sin6_addr.s6_addr);
                if (sa6->sin6_scope_id)
                    addr.setScopeId(QString::number(sa6->sin6_scope_id));
                if (!addresses.contains(addr))
                    addresses.append(addr);
                break;
            }
            default:
                results.setError(QHostInfo::UnknownError);
                results.setErrorString(QCoreApplication::translate("QHostInfoAgent", "Unknown address type"));
            }
            node = node->ai_next;
        }
        if (addresses.isEmpty()) {
            // Reached the end of the list, but no addresses were found; this
            // means the list contains one or more unknown address types.
            results.setError(QHostInfo::UnknownError);
            results.setErrorString(QCoreApplication::translate("QHostInfoAgent", "Unknown address type"));
        }

        results.setAddresses(addresses);
        freeaddrinfo(res);
    } else {
        switch (result) {
#ifdef Q_OS_WIN
        case WSAHOST_NOT_FOUND: //authoritative not found
        case WSATRY_AGAIN: //non authoritative not found
        case WSANO_DATA: //valid name, no associated address
#else
        case EAI_NONAME:
        case EAI_FAIL:
#  ifdef EAI_NODATA // EAI_NODATA is deprecated in RFC 3493
        case EAI_NODATA:
#  endif
#endif
            results.setError(QHostInfo::HostNotFound);
            results.setErrorString(QCoreApplication::translate("QHostInfoAgent", "Host not found"));
            break;
        default:
            results.setError(QHostInfo::UnknownError);
#ifdef Q_OS_WIN
            results.setErrorString(QString::fromWCharArray(gai_strerror(result)));
#else
            results.setErrorString(QString::fromLocal8Bit(gai_strerror(result)));
#endif
            break;
        }
    }

#if defined(QHOSTINFO_DEBUG)
    if (results.error() != QHostInfo::NoError) {
        qDebug("QHostInfoAgent::fromName(): error #%d %s",
               h_errno, results.errorString().toLatin1().constData());
    } else {
        QString tmp;
        QList<QHostAddress> addresses = results.addresses();
        for (int i = 0; i < addresses.count(); ++i) {
            if (i != 0) tmp += ", "_L1;
            tmp += addresses.at(i).toString();
        }
        qDebug("QHostInfoAgent::fromName(): found %i entries for \"%s\": {%s}",
               addresses.count(), aceHostname.constData(),
               tmp.toLatin1().constData());
    }
#endif

    return results;
}